

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  allocator_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
  PVar2;
  initializer_list<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
  __l;
  vector<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
  local_f0;
  TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
  local_d8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_d8._0_8_ = *in_RSI;
  local_d8._8_8_ = in_RSI[1];
  local_d8._16_8_ = in_RSI[2];
  local_d8._36_8_ = *(undefined8 *)((long)in_RSI + 0x24);
  local_d8.bit_depth = (aom_bit_depth_t)((ulong)*(undefined8 *)((long)in_RSI + 0x1c) >> 0x20);
  local_d8.func._0_4_ = (undefined4)in_RSI[3];
  local_d8.func._4_4_ = (undefined4)((ulong)in_RSI[3] >> 0x20);
  local_a8 = in_RSI[6];
  uStack_a0 = in_RSI[7];
  uStack_98 = in_RSI[8];
  uStack_84 = *(undefined8 *)((long)in_RSI + 0x54);
  uStack_88 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x4c) >> 0x20);
  uStack_90 = (undefined4)in_RSI[9];
  local_8c = (undefined4)((ulong)in_RSI[9] >> 0x20);
  local_78 = in_RSI[0xc];
  uStack_70 = in_RSI[0xd];
  local_68 = in_RSI[0xe];
  uStack_54 = *(undefined8 *)((long)in_RSI + 0x84);
  uStack_60 = (undefined4)in_RSI[0xf];
  uStack_5c = (undefined4)*(undefined8 *)((long)in_RSI + 0x7c);
  uStack_58 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x7c) >> 0x20);
  local_48 = in_RSI[0x12];
  uStack_40 = in_RSI[0x13];
  uStack_38 = in_RSI[0x14];
  uStack_24 = *(undefined8 *)((long)in_RSI + 0xb4);
  uStack_28 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0xac) >> 0x20);
  uStack_30 = (undefined4)in_RSI[0x15];
  local_2c = (undefined4)((ulong)in_RSI[0x15] >> 0x20);
  __l._M_len = 4;
  __l._M_array = &local_d8;
  std::
  vector<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
  ::vector(&local_f0,__l,in_RCX);
  PVar2 = ValuesIn<std::vector<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*)>,std::allocator<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*)>>>>
                    ((testing *)this,&local_f0);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_f0.
      super__Vector_base<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }